

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetUseIntegratorFusedKernels(void *cvode_mem,int onoff)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
  }
  else {
    msgfmt = "CVODE was not built with fused integrator kernels enabled";
    iVar1 = -0x16;
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetUseIntegratorFusedKernels",msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetUseIntegratorFusedKernels(void *cvode_mem, booleantype onoff)
{
  CVodeMem cv_mem;
#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
  N_Vector_ID id;
#endif

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE",
                   "CVodeSetUseIntegratorFusedKernels", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
  id = N_VGetVectorID(cv_mem->cv_ewt);
  if (!cv_mem->cv_MallocDone ||
      (id != SUNDIALS_NVEC_CUDA && id != SUNDIALS_NVEC_HIP)) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE",
                   "CVodeSetUseIntegratorFusedKernels",
                   "Fused Kernels not supported for the provided vector");
    return(CV_MEM_NULL);
  }
  cv_mem->cv_usefused = onoff;
  return(CV_SUCCESS);
#else
  cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE",
                 "CVodeSetUseIntegratorFusedKernels",
                 "CVODE was not built with fused integrator kernels enabled");
  return(CV_ILL_INPUT);
#endif
}